

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::IsLaterStandard(cmMakefile *this,string *lang,string *lhs,string *rhs)

{
  pointer pcVar1;
  int iVar2;
  char **ppcVar3;
  long *plVar4;
  long *plVar5;
  bool bVar6;
  long *local_a0 [2];
  long local_90 [2];
  long *local_80 [2];
  long local_70 [2];
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  iVar2 = std::__cxx11::string::compare((char *)lang);
  if (iVar2 == 0) {
    pcVar1 = (rhs->_M_dataplus)._M_p;
    local_80[0] = local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_80,pcVar1,pcVar1 + rhs->_M_string_length);
    ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                        (C_STANDARDS,(char **)&DAT_005c89c8,(cmStrCmp *)local_80);
    if (local_80[0] != local_70) {
      operator_delete(local_80[0],local_70[0] + 1);
    }
    plVar5 = local_30;
    pcVar1 = (lhs->_M_dataplus)._M_p;
    local_40[0] = plVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar1,pcVar1 + lhs->_M_string_length);
    ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                        (ppcVar3,(char **)&DAT_005c89c8,(cmStrCmp *)local_40);
    bVar6 = ppcVar3 != (char **)&DAT_005c89c8;
    plVar4 = local_40[0];
  }
  else {
    pcVar1 = (rhs->_M_dataplus)._M_p;
    local_a0[0] = local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,pcVar1,pcVar1 + rhs->_M_string_length);
    ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,&PTR_anon_var_dwarf_1b5c43_005c89e8,(cmStrCmp *)local_a0);
    if (local_a0[0] != local_90) {
      operator_delete(local_a0[0],local_90[0] + 1);
    }
    plVar5 = local_50;
    pcVar1 = (lhs->_M_dataplus)._M_p;
    local_60[0] = plVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,pcVar1,pcVar1 + lhs->_M_string_length);
    ppcVar3 = std::find_if<char_const*const*,cmStrCmp>
                        (ppcVar3,&PTR_anon_var_dwarf_1b5c43_005c89e8,(cmStrCmp *)local_60);
    bVar6 = ppcVar3 != &PTR_anon_var_dwarf_1b5c43_005c89e8;
    plVar4 = local_60[0];
  }
  if (plVar4 != plVar5) {
    operator_delete(plVar4,*plVar5 + 1);
  }
  return bVar6;
}

Assistant:

bool cmMakefile::IsLaterStandard(std::string const& lang,
                                 std::string const& lhs,
                                 std::string const& rhs)
{
  if (lang == "C")
    {
    const char * const *rhsIt = std::find_if(cmArrayBegin(C_STANDARDS),
                                            cmArrayEnd(C_STANDARDS),
                                            cmStrCmp(rhs));

    return std::find_if(rhsIt, cmArrayEnd(C_STANDARDS),
                        cmStrCmp(lhs)) != cmArrayEnd(C_STANDARDS);
    }
  const char * const *rhsIt = std::find_if(cmArrayBegin(CXX_STANDARDS),
                                           cmArrayEnd(CXX_STANDARDS),
                                           cmStrCmp(rhs));

  return std::find_if(rhsIt, cmArrayEnd(CXX_STANDARDS),
                      cmStrCmp(lhs)) != cmArrayEnd(CXX_STANDARDS);
}